

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInDescriptor
          (Generator *this,Descriptor *descriptor,Descriptor *containing_descriptor)

{
  long lVar1;
  long lVar2;
  long lVar3;
  string local_50;
  
  if (0 < *(int *)(descriptor + 0x38)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      FixForeignFieldsInDescriptor
                (this,(Descriptor *)(*(long *)(descriptor + 0x40) + lVar3),descriptor);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x78;
    } while (lVar2 < *(int *)(descriptor + 0x38));
  }
  if (0 < *(int *)(descriptor + 0x2c)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x30);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"fields_by_name","");
      FixForeignFieldsInField(this,descriptor,(FieldDescriptor *)(lVar1 + lVar3),&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x78;
    } while (lVar2 < *(int *)(descriptor + 0x2c));
  }
  FixContainingTypeInDescriptor<google::protobuf::Descriptor>(this,descriptor,containing_descriptor)
  ;
  if (0 < *(int *)(descriptor + 0x48)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      FixContainingTypeInDescriptor<google::protobuf::EnumDescriptor>
                (this,(EnumDescriptor *)(*(long *)(descriptor + 0x50) + lVar3),descriptor);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x38;
    } while (lVar2 < *(int *)(descriptor + 0x48));
  }
  return;
}

Assistant:

void Generator::FixForeignFieldsInDescriptor(
    const Descriptor& descriptor,
    const Descriptor* containing_descriptor) const {
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixForeignFieldsInDescriptor(*descriptor.nested_type(i), &descriptor);
  }

  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field_descriptor = *descriptor.field(i);
    FixForeignFieldsInField(&descriptor, field_descriptor, "fields_by_name");
  }

  FixContainingTypeInDescriptor(descriptor, containing_descriptor);
  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *descriptor.enum_type(i);
    FixContainingTypeInDescriptor(enum_descriptor, &descriptor);
  }
}